

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O2

void __thiscall PrintType::print(PrintType *this,Printer *p)

{
  Type *pTVar1;
  _func_int **pp_Var2;
  PrintType *pPVar3;
  uint uVar4;
  char *s;
  size_t i;
  ulong uVar5;
  Type local_50;
  Format<PrintType> local_48;
  
  uVar4 = (*this->type->_vptr_Type[2])();
  if (0xb < uVar4) {
    return;
  }
  switch(uVar4) {
  case 0:
    s = "Int";
    break;
  case 1:
    goto switchD_001240d7_caseD_1;
  case 2:
    s = "Function";
    break;
  case 3:
    s = "Struct";
    break;
  case 4:
    s = "Enum";
    break;
  case 5:
    pTVar1 = this->type;
    Printer::print(p,"Tuple((");
    for (uVar5 = 0; pp_Var2 = pTVar1[1]._vptr_Type,
        uVar5 < (ulong)((long)pTVar1[2]._vptr_Type - (long)pp_Var2 >> 3); uVar5 = uVar5 + 1) {
      pPVar3 = (PrintType *)pp_Var2[uVar5];
      if (uVar5 != 0) {
        Printer::print(p,",");
      }
      local_48.t.t0 = pPVar3;
      print((PrintType *)&local_48,p);
    }
    Printer::print(p,"))");
    return;
  case 6:
    local_50._vptr_Type = this->type[1]._vptr_Type;
    local_48.s = "Array(%)";
    goto LAB_001241b8;
  case 7:
    s = "String";
    break;
  case 8:
    s = "StringIterator";
    break;
  case 9:
    s = "Void";
    break;
  case 10:
    local_50._vptr_Type = this->type[1]._vptr_Type;
    local_48.s = "Reference(%)";
    local_48.t.t0 = (PrintType *)&local_50;
    Format<PrintType>::print(&local_48,p);
  case 0xb:
    local_50._vptr_Type = this->type[1]._vptr_Type;
    local_48.s = "Type(%)";
LAB_001241b8:
    local_48.t.t0 = (PrintType *)&local_50;
    Format<PrintType>::print(&local_48,p);
switchD_001240d7_caseD_1:
    return;
  }
  Printer::print(p,s);
  return;
}

Assistant:

void print(const Printer& p) const {
		switch (type->get_id()) {
		case TypeId::INT:
			p.print("Int");
			break;
		case TypeId::CLOSURE:
			p.print("Function");
			break;
		case TypeId::STRUCT:
			p.print("Struct");
			break;
		case TypeId::ENUM:
			p.print("Enum");
			break;
		case TypeId::TUPLE:
			{
				const TupleType* tuple_type = static_cast<const TupleType*>(type);
				p.print("Tuple((");
				for (std::size_t i = 0; i < tuple_type->get_element_types().size(); ++i) {
					const Type* element_type = tuple_type->get_element_types()[i];
					if (i > 0) p.print(",");
					p.print(PrintType(element_type));
				}
				p.print("))");
				break;
			}
		case TypeId::ARRAY:
			{
				const Type* element_type = static_cast<const ArrayType*>(type)->get_element_type();
				p.print(format("Array(%)", PrintType(element_type)));
				break;
			}
		case TypeId::STRING:
			p.print("String");
			break;
		case TypeId::STRING_ITERATOR:
			p.print("StringIterator");
			break;
		case TypeId::VOID:
			p.print("Void");
			break;
		case TypeId::REFERENCE:
			{
				const Type* value_type = static_cast<const ReferenceType*>(type)->get_type();
				p.print(format("Reference(%)", PrintType(value_type)));
			}
		case TypeId::TYPE:
			{
				const Type* type_type = static_cast<const TypeType*>(type)->get_type();
				p.print(format("Type(%)", PrintType(type_type)));
				break;
			}
		default:
			break;
		}
	}